

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O1

void Fire(int Cooling,int Sparking,int SpeedDelay)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  int i;
  long lVar5;
  int j;
  
  lVar5 = 0;
  do {
    lVar2 = random();
    iVar1 = (int)((double)lVar2 * (double)((Cooling * 10) / 0x18 + 2) * 4.656612873077393e-10);
    bVar4 = Fire::heat[lVar5] - (char)iVar1;
    if ((int)(uint)Fire::heat[lVar5] < iVar1) {
      bVar4 = '\0';
    }
    Fire::heat[lVar5] = bVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x18);
  uVar3 = 0x18;
  do {
    *(char *)(uVar3 + 0x1061af) =
         (char)(((uint)*(byte *)(uVar3 + 0x1061ae) + (uint)*(byte *)(uVar3 + 0x1061ad) * 2) / 3);
    uVar3 = uVar3 - 1;
  } while (2 < uVar3);
  lVar5 = random();
  if ((int)((double)lVar5 * 255.0 * 4.656612873077393e-10) < Sparking) {
    lVar5 = random();
    iVar1 = (int)((double)lVar5 * 7.0 * 4.656612873077393e-10);
    bVar4 = Fire::heat[iVar1];
    lVar5 = random();
    Fire::heat[iVar1] = (char)(int)((double)lVar5 * 95.0 * 4.656612873077393e-10) + bVar4 + 0xa0;
  }
  lVar5 = 0;
  do {
    setPixelHeatColor((int)lVar5,Fire::heat[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x18);
  WS2812B::Led::show(&leds);
  usleep(SpeedDelay * 1000);
  return;
}

Assistant:

void Fire(int Cooling, int Sparking, int SpeedDelay) {
    static byte heat[NUM_LEDS];
    int cooldown;

    // Step 1.  Cool down every cell a little
    for( int i = 0; i < NUM_LEDS; i++) {
        cooldown = myRandom(0, ((Cooling * 10) / NUM_LEDS) + 2);

        if(cooldown>heat[i]) {
            heat[i]=0;
        } else {
            heat[i]=heat[i]-cooldown;
        }
    }

    // Step 2.  Heat from each cell drifts 'up' and diffuses a little
    for( int k= NUM_LEDS - 1; k >= 2; k--) {
        heat[k] = (heat[k - 1] + heat[k - 2] + heat[k - 2]) / 3;
    }

    // Step 3.  Randomly ignite new 'sparks' near the bottom
    if( myRandom(0, 255) < Sparking ) {
        int y = myRandom(0, 7);
        heat[y] = heat[y] + myRandom(160,255);
        //heat[y] = random(160,255);
    }

    // Step 4.  Convert heat to LED colors
    for( int j = 0; j < NUM_LEDS; j++) {
        setPixelHeatColor(j, heat[j] );
    }

    showStrip();
    delay(SpeedDelay);
}